

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O3

Instruction * __thiscall
spvtools::opt::anon_unknown_15::LCSSARewriter::UseRewriter::GetOrBuildIncoming
          (UseRewriter *this,uint32_t bb_id)

{
  uint32_t *puVar1;
  CFG *this_00;
  pointer puVar2;
  IRContext *this_01;
  iterator instr;
  char cVar3;
  uint32_t uVar4;
  BasicBlock *pBVar5;
  IRContext *pIVar6;
  const_iterator cVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar9;
  Instruction *pIVar10;
  pointer puVar11;
  mapped_type pIVar12;
  ulong uVar13;
  Instruction *pIVar14;
  __hashtable *__h;
  BasicBlock *bb;
  InstructionBuilder builder;
  vector<unsigned_int,_std::allocator<unsigned_int>_> incomings;
  __node_gen_type __node_gen;
  uint32_t local_94;
  BasicBlock *local_90;
  undefined1 local_88 [32];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  BasicBlock *local_48;
  mapped_type local_40;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *local_38;
  
  local_94 = bb_id;
  pBVar5 = CFG::block(this->base_->cfg_,bb_id);
  if (pBVar5 == (BasicBlock *)0x0) {
    __assert_fail("base_->cfg_->block(bb_id) != nullptr && \"Unknown basic block\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_utils.cpp"
                  ,0x99,
                  "Instruction *spvtools::opt::(anonymous namespace)::LCSSARewriter::UseRewriter::GetOrBuildIncoming(uint32_t)"
                 );
  }
  pIVar6 = (IRContext *)
           std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->bb_to_phi_,&local_94);
  if ((mapped_type)pIVar6->syntax_context_ != (mapped_type)0x0) {
    return (mapped_type)pIVar6->syntax_context_;
  }
  local_90 = CFG::block(this->base_->cfg_,local_94);
  cVar7 = std::
          _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&this->base_->exit_bb_->_M_h,&local_90);
  if (cVar7.super__Node_iterator_base<spvtools::opt::BasicBlock_*,_false>._M_cur ==
      (__node_type *)0x0) {
    pvVar8 = GetDefiningBlocks(this->base_,local_94);
    pBVar5 = local_90;
    puVar1 = (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (4 < (ulong)((long)(pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)puVar1)) {
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      this_00 = this->base_->cfg_;
      local_48 = local_90;
      pIVar10 = (local_90->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar4 = 0;
      if (pIVar10->has_result_id_ == true) {
        uVar4 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
      }
      pvVar9 = CFG::preds(this_00,uVar4);
      puVar11 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      puVar2 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if ((long)puVar2 - (long)puVar11 ==
          (long)(pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start) {
        if (puVar2 != puVar11) {
          uVar13 = 0;
          do {
            pIVar10 = GetOrBuildIncoming(this,(pvVar8->
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              )._M_impl.super__Vector_impl_data._M_start[uVar13]);
            uVar4 = 0;
            if (pIVar10->has_result_id_ == true) {
              uVar4 = Instruction::GetSingleWordOperand(pIVar10,(uint)pIVar10->has_type_id_);
            }
            local_88._0_4_ = uVar4;
            if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&local_68,
                         (iterator)
                         local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(uint *)local_88);
            }
            else {
              *local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = uVar4;
              local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            puVar11 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,
                         (iterator)
                         local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,puVar11 + uVar13);
              puVar11 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start;
            }
            else {
              *local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = puVar11[uVar13];
              local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 < (ulong)((long)(pvVar9->
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)puVar11 >> 2));
        }
        this_01 = this->base_->context_;
        instr.node_ = (local_48->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                      super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
        local_88._8_8_ = IRContext::get_instr_block(this_01,instr.node_);
        local_88._24_4_ = kAnalysisInstrToBlockMapping;
        uVar4 = 0;
        local_88._0_8_ = this_01;
        local_88._16_8_ = instr.node_;
        if (this->def_insn_->has_type_id_ == true) {
          uVar4 = Instruction::GetSingleWordOperand(this->def_insn_,0);
        }
        local_40 = InstructionBuilder::AddPhi((InstructionBuilder *)local_88,uVar4,&local_68,0);
        local_38 = &this->rewritten_;
        std::
        _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                  ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_38,&local_40);
        pIVar12 = local_40;
        if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_68.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_68.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        pIVar6->syntax_context_ = (spv_context)pIVar12;
        return pIVar12;
      }
      __assert_fail("bb_preds.size() == defining_blocks.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_utils.cpp"
                    ,0x71,
                    "Instruction *spvtools::opt::(anonymous namespace)::LCSSARewriter::UseRewriter::CreatePhiInstruction(BasicBlock *, const std::vector<uint32_t> &)"
                   );
    }
    if (local_94 != this->base_->merge_block_id_) {
      pIVar12 = GetOrBuildIncoming(this,*puVar1);
      goto LAB_0024ed47;
    }
    pIVar10 = GetOrBuildIncoming(this,*puVar1);
  }
  else {
    local_88._24_8_ =
         std::
         _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_utils.cpp:166:35)>
         ::_M_invoke;
    local_88._16_8_ =
         std::
         _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_utils.cpp:166:35)>
         ::_M_manager;
    pIVar10 = (local_90->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
              super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    local_88._0_8_ = pIVar6;
    local_88._8_8_ = this;
    if ((pIVar10 != (Instruction *)0x0) &&
       ((pIVar10->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
      while (pIVar10 != (Instruction *)0x0) {
        pIVar14 = (pIVar10->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        if ((pIVar14->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
          pIVar14 = (Instruction *)0x0;
        }
        if (pIVar10->opcode_ != OpPhi) break;
        local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)pIVar10;
        if ((Instruction *)local_88._16_8_ == (Instruction *)0x0) {
          std::__throw_bad_function_call();
        }
        cVar3 = (*(code *)local_88._24_8_)(local_88,&local_68);
        pIVar10 = pIVar14;
        if (cVar3 == '\0') {
          if ((Instruction *)local_88._16_8_ != (Instruction *)0x0) {
            (*(code *)local_88._16_8_)(local_88,local_88,3);
          }
          return (mapped_type)pIVar6->syntax_context_;
        }
      }
      if ((Instruction *)local_88._16_8_ != (Instruction *)0x0) {
        (*(code *)local_88._16_8_)(local_88,local_88,3);
      }
    }
    pIVar10 = this->def_insn_;
    pBVar5 = local_90;
  }
  pIVar12 = CreatePhiInstruction(this,pBVar5,pIVar10);
LAB_0024ed47:
  pIVar6->syntax_context_ = (spv_context)pIVar12;
  return pIVar12;
}

Assistant:

Instruction* GetOrBuildIncoming(uint32_t bb_id) {
      assert(base_->cfg_->block(bb_id) != nullptr && "Unknown basic block");

      Instruction*& incoming_phi = bb_to_phi_[bb_id];
      if (incoming_phi) {
        return incoming_phi;
      }

      BasicBlock* bb = &*base_->cfg_->block(bb_id);
      // If this is an exit basic block, look if there already is an eligible
      // phi instruction. An eligible phi has |def_insn_| as all incoming
      // values.
      if (base_->exit_bb_.count(bb)) {
        // Look if there is an eligible phi in this block.
        if (!bb->WhileEachPhiInst([&incoming_phi, this](Instruction* phi) {
              for (uint32_t i = 0; i < phi->NumInOperands(); i += 2) {
                if (phi->GetSingleWordInOperand(i) != def_insn_.result_id())
                  return true;
              }
              incoming_phi = phi;
              rewritten_.insert(incoming_phi);
              return false;
            })) {
          return incoming_phi;
        }
        incoming_phi = CreatePhiInstruction(bb, def_insn_);
        return incoming_phi;
      }

      // Get the block that defines the value to use for each predecessor.
      // If the vector has 1 value, then it means that this block does not need
      // to build a phi instruction unless |bb_id| is the loop merge block.
      const std::vector<uint32_t>& defining_blocks =
          base_->GetDefiningBlocks(bb_id);

      // Special case for structured loops: merge block might be different from
      // the exit block set. To maintain structured properties it will ease
      // transformations if the merge block also holds a phi instruction like
      // the exit ones.
      if (defining_blocks.size() > 1 || bb_id == base_->merge_block_id_) {
        if (defining_blocks.size() > 1) {
          incoming_phi = CreatePhiInstruction(bb, defining_blocks);
        } else {
          assert(bb_id == base_->merge_block_id_);
          incoming_phi =
              CreatePhiInstruction(bb, *GetOrBuildIncoming(defining_blocks[0]));
        }
      } else {
        incoming_phi = GetOrBuildIncoming(defining_blocks[0]);
      }

      return incoming_phi;
    }